

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pure.cpp
# Opt level: O3

string * fs_stem_abi_cxx11_(string_view path)

{
  uint uVar1;
  long lVar2;
  _List *p_Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  path *this;
  undefined1 auVar4 [16];
  string_type local_c0;
  path local_a0;
  path local_78;
  path local_50;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  this = &local_a0;
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (this,&local_28,auto_format);
  if (local_a0._M_pathname._M_string_length != 0) {
    uVar1 = local_a0._32_4_;
    if ((~local_a0._M_cmpts & 3) == 0) {
LAB_0010b08a:
      std::filesystem::__cxx11::path::path(&local_78,this);
      goto LAB_0010b0a3;
    }
    if (((local_a0._32_8_ & 3) == 0) &&
       (local_a0._M_pathname._M_dataplus._M_p[local_a0._M_pathname._M_string_length - 1] != '/')) {
      if ((local_a0._32_8_ & 3) == 0) {
        lVar2 = std::filesystem::__cxx11::path::_List::end();
        this = (path *)(lVar2 + -0x30);
        p_Var3 = (_List *)(lVar2 + -0x10);
        if ((local_a0._32_8_ & 3) != 0) {
          p_Var3 = &local_a0._M_cmpts;
          this = &local_a0;
        }
        uVar1 = (uint)*(undefined8 *)p_Var3;
      }
      else {
        this = &local_a0;
      }
      if ((~uVar1 & 3) == 0) goto LAB_0010b08a;
    }
  }
  std::filesystem::__cxx11::path::path(&local_78);
LAB_0010b0a3:
  auVar4 = std::filesystem::__cxx11::path::_M_find_extension();
  if (auVar4._8_8_ == 0 || auVar4._0_8_ == 0) {
    std::filesystem::__cxx11::path::path(&local_50);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_c0,auVar4._0_8_);
    std::filesystem::__cxx11::path::path(&local_50,&local_c0,auto_format);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
  }
  std::filesystem::__cxx11::path::generic_string<char,std::char_traits<char>,std::allocator<char>>
            (in_RDI,&local_50,(allocator<char> *)&local_c0);
  std::filesystem::__cxx11::path::~path(&local_50);
  std::filesystem::__cxx11::path::~path(&local_78);
  std::filesystem::__cxx11::path::~path(&local_a0);
  return in_RDI;
}

Assistant:

std::string fs_stem(std::string_view path)
{
#ifdef HAVE_CXX_FILESYSTEM
  return std::filesystem::path(path).filename().stem().generic_string();
#else
  std::string r = fs_file_name(path);
  // handle special case a/..
  if (r == "..")
    return r;

  // find last dot
  std::string::size_type i = r.find_last_of('.');

  return (i != std::string::npos && i != 0)
    ? r.substr(0, i)
    : r;
#endif
}